

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O2

void __thiscall Js::DelayedFreeArrayBuffer::ReleaseOnlyNonMarkedObject(DelayedFreeArrayBuffer *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  Type *ppAVar4;
  undefined1 local_30 [8];
  EditingIterator iter;
  
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  local_30 = (undefined1  [8])this;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount> *)
       this;
  while( true ) {
    bVar2 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_30);
    if (!bVar2) break;
    ppAVar4 = SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>
              ::Iterator::Data((Iterator *)local_30);
    iVar3 = (*(*ppAVar4)->_vptr_ArrayBufferContentForDelayedFreeBase[6])();
    pp_Var1 = (*ppAVar4)->_vptr_ArrayBufferContentForDelayedFreeBase;
    if ((char)iVar3 == '\0') {
      (*pp_Var1[2])();
      (*(*ppAVar4)->_vptr_ArrayBufferContentForDelayedFreeBase[7])();
      SList<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>::
      EditingIterator::RemoveCurrent((EditingIterator *)local_30);
    }
    else {
      (*pp_Var1[5])(*ppAVar4,0);
    }
  }
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ReleaseOnlyNonMarkedObject()
    {
        FOREACH_SLIST_ENTRY_EDITING(ArrayBufferContentForDelayedFreeBase*, item, &this->listOfBuffers, iter)
        {
            if (!item->IsMarked())
            {
                item->Release();
                item->ClearSelfOnly();
                iter.RemoveCurrent();
            }
            else
            {
                // Reset the mark bit
                item->SetMarkBit(false);
            }
        } NEXT_SLIST_ENTRY_EDITING
    }